

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseStats::TestCaseStats(TestCaseStats *this,TestCaseStats *param_2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_RSI;
  undefined8 *in_RDI;
  TestCaseInfo *in_stack_00000008;
  TestCaseInfo *in_stack_00000010;
  
  *in_RDI = &PTR__TestCaseStats_002c1ef0;
  TestCaseInfo::TestCaseInfo(in_stack_00000010,in_stack_00000008);
  uVar1 = *(undefined8 *)(in_RSI + 0x118);
  uVar2 = *(undefined8 *)(in_RSI + 0x120);
  uVar3 = *(undefined8 *)(in_RSI + 0x128);
  uVar4 = *(undefined8 *)(in_RSI + 0x130);
  uVar5 = *(undefined8 *)(in_RSI + 0x140);
  in_RDI[0x27] = *(undefined8 *)(in_RSI + 0x138);
  in_RDI[0x28] = uVar5;
  in_RDI[0x25] = uVar3;
  in_RDI[0x26] = uVar4;
  in_RDI[0x23] = uVar1;
  in_RDI[0x24] = uVar2;
  std::__cxx11::string::string((string *)(in_RDI + 0x29),(string *)(in_RSI + 0x148));
  std::__cxx11::string::string((string *)(in_RDI + 0x2d),(string *)(in_RSI + 0x168));
  *(byte *)(in_RDI + 0x31) = *(byte *)(in_RSI + 0x188) & 1;
  return;
}

Assistant:

TestCaseStats( TestCaseStats const& )              = default;